

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

void __thiscall lts2::LBDOperator::~LBDOperator(LBDOperator *this)

{
  LBDOperator *this_local;
  
  (this->super_LinearOperator)._vptr_LinearOperator = (_func_int **)&PTR__LBDOperator_0010e818;
  if ((this->_sensitiveCells != (IntegratingCell *)0x0) &&
     (this->_sensitiveCells != (IntegratingCell *)0x0)) {
    operator_delete__(this->_sensitiveCells);
  }
  if ((this->_basisFunctions != (BasisFunction *)0x0) &&
     (this->_basisFunctions != (BasisFunction *)0x0)) {
    operator_delete__(this->_basisFunctions);
  }
  cv::Mat::~Mat(&this->_integralImage);
  LinearOperator::~LinearOperator(&this->super_LinearOperator);
  return;
}

Assistant:

lts2::LBDOperator::~LBDOperator()
{
    if (_sensitiveCells)
        delete[] _sensitiveCells;
    if (_basisFunctions)
      delete[]_basisFunctions;
}